

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrEventDataLocalizationChangedML *value)

{
  pointer *this;
  pointer *this_00;
  bool bVar1;
  ValidateXrHandleResult VVar2;
  string local_b10 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_af0;
  allocator local_ad1;
  string local_ad0 [32];
  string local_ab0 [32];
  ostringstream local_a90 [8];
  ostringstream oss_enum_2;
  allocator local_911;
  string local_910 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_8f0;
  allocator local_8d1;
  string local_8d0 [36];
  ValidateXrFlagsResult local_8ac;
  string local_8a8 [4];
  ValidateXrFlagsResult localization_map_error_flags_ml_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_888;
  allocator local_869;
  string local_868 [32];
  string local_848 [32];
  ostringstream local_828 [8];
  ostringstream oss_enum_1;
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [39];
  allocator local_659;
  string local_658 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_638;
  allocator local_619;
  string local_618 [32];
  string local_5f8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_5d8;
  allocator local_5b9;
  string local_5b8 [32];
  string local_598 [32];
  ostringstream local_578 [8];
  ostringstream oss_enum;
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_390;
  allocator local_371;
  string local_370 [32];
  XrSession_T local_350 [32];
  ostringstream local_330 [8];
  ostringstream oss;
  allocator local_1b1;
  ValidateXrHandleResult handle_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrEventDataLocalizationChangedML *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrEventDataLocalizationChangedML",
               value->type,"VUID-XrEventDataLocalizationChangedML-type-type",
               XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML,
               "XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"VUID-XrEventDataLocalizationChangedML-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrEventDataLocalizationChangedML struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrEventDataLocalizationChangedML : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"VUID-XrEventDataLocalizationChangedML-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&handle_result,
                 "Multiple structures of the same type(s) in \"next\" chain for XrEventDataLocalizationChangedML struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)&handle_result);
      std::__cxx11::string::~string((string *)&handle_result);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    VVar2 = VerifyXrSessionHandle(&value->session);
    if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,"XrEventDataLocalizationChangedML",&local_3d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,"state",&local_3f9);
      bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_3d0,(string *)local_3f8,
                             objects_info,value->state);
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        instance_info_local._4_4_ =
             ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,&value->map
                             );
        if (instance_info_local._4_4_ == XR_SUCCESS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_680,"XrEventDataLocalizationChangedML",&local_681);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_6a8,"confidence",&local_6a9);
          bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_680,(string *)local_6a8,
                                 objects_info,value->confidence);
          std::__cxx11::string::~string(local_6a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
          std::__cxx11::string::~string(local_680);
          std::allocator<char>::~allocator((allocator<char> *)&local_681);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_8ac = ValidateXrLocalizationMapErrorFlagsML(value->errorFlags);
            if (local_8ac == VALIDATE_XR_FLAGS_ZERO) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_8d0,
                         "VUID-XrEventDataLocalizationChangedML-errorFlags-requiredbitmask",
                         &local_8d1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_8f0,objects_info);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_910,
                         "XrLocalizationMapErrorFlagsML \"errorFlags\" flag must be non-zero",
                         &local_911);
              CoreValidLogMessage(instance_info,(string *)local_8d0,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,&local_8f0,(string *)local_910);
              std::__cxx11::string::~string(local_910);
              std::allocator<char>::~allocator((allocator<char> *)&local_911);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_8f0);
              std::__cxx11::string::~string(local_8d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
              instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
            }
            else if (local_8ac != VALIDATE_XR_FLAGS_SUCCESS) {
              std::__cxx11::ostringstream::ostringstream(local_a90);
              std::operator<<((ostream *)local_a90,
                              "XrEventDataLocalizationChangedML invalid member XrLocalizationMapErrorFlagsML \"errorFlags\" flag value "
                             );
              Uint32ToHexString_abi_cxx11_((uint32_t)local_ab0);
              std::operator<<((ostream *)local_a90,local_ab0);
              std::__cxx11::string::~string(local_ab0);
              std::operator<<((ostream *)local_a90," contains illegal bit");
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_ad0,"VUID-XrEventDataLocalizationChangedML-errorFlags-parameter",
                         &local_ad1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_af0,objects_info);
              std::__cxx11::ostringstream::str();
              CoreValidLogMessage(instance_info,(string *)local_ad0,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,&local_af0,local_b10);
              std::__cxx11::string::~string((string *)local_b10);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_af0);
              std::__cxx11::string::~string(local_ad0);
              std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
              instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
              std::__cxx11::ostringstream::~ostringstream(local_a90);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_828);
            std::operator<<((ostream *)local_828,
                            "XrEventDataLocalizationChangedML contains invalid XrLocalizationMapConfidenceML \"confidence\" enum value "
                           );
            Uint32ToHexString_abi_cxx11_((uint32_t)local_848);
            std::operator<<((ostream *)local_828,local_848);
            std::__cxx11::string::~string(local_848);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_868,"VUID-XrEventDataLocalizationChangedML-confidence-parameter",
                       &local_869);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_888,objects_info);
            std::__cxx11::ostringstream::str();
            CoreValidLogMessage(instance_info,(string *)local_868,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_888,local_8a8);
            std::__cxx11::string::~string((string *)local_8a8);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_888);
            std::__cxx11::string::~string(local_868);
            std::allocator<char>::~allocator((allocator<char> *)&local_869);
            instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
            std::__cxx11::ostringstream::~ostringstream(local_828);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_618,"VUID-XrEventDataLocalizationChangedML-map-parameter",&local_619);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_638,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_658,"Structure XrEventDataLocalizationChangedML member map is invalid",
                     &local_659);
          CoreValidLogMessage(instance_info,(string *)local_618,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_638,(string *)local_658);
          std::__cxx11::string::~string(local_658);
          std::allocator<char>::~allocator((allocator<char> *)&local_659);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_638);
          std::__cxx11::string::~string(local_618);
          std::allocator<char>::~allocator((allocator<char> *)&local_619);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_578);
        std::operator<<((ostream *)local_578,
                        "XrEventDataLocalizationChangedML contains invalid XrLocalizationMapStateML \"state\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_((uint32_t)local_598);
        std::operator<<((ostream *)local_578,local_598);
        std::__cxx11::string::~string(local_598);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5b8,"VUID-XrEventDataLocalizationChangedML-state-parameter",&local_5b9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_5d8,objects_info);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(instance_info,(string *)local_5b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_5d8,local_5f8);
        std::__cxx11::string::~string((string *)local_5f8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_5d8);
        std::__cxx11::string::~string(local_5b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        std::__cxx11::ostringstream::~ostringstream(local_578);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,"Invalid XrSession handle \"session\" ");
      HandleToHexString<XrSession_T*>(local_350);
      std::operator<<((ostream *)local_330,(string *)local_350);
      std::__cxx11::string::~string((string *)local_350);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_370,"VUID-XrEventDataLocalizationChangedML-session-parameter",&local_371);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_390,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_370,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_390,local_3b0);
      std::__cxx11::string::~string((string *)local_3b0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_390);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      instance_info_local._4_4_ = XR_ERROR_HANDLE_INVALID;
      std::__cxx11::ostringstream::~ostringstream(local_330);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrEventDataLocalizationChangedML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrEventDataLocalizationChangedML",
                             value->type, "VUID-XrEventDataLocalizationChangedML-type-type", XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML, "XR_TYPE_EVENT_DATA_LOCALIZATION_CHANGED_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrEventDataLocalizationChangedML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrEventDataLocalizationChangedML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrEventDataLocalizationChangedML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&value->session);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrSession handle \"session\" ";
            oss << HandleToHexString(value->session);
            CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-session-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Make sure the enum type XrLocalizationMapStateML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrEventDataLocalizationChangedML", "state", objects_info, value->state)) {
        std::ostringstream oss_enum;
        oss_enum << "XrEventDataLocalizationChangedML contains invalid XrLocalizationMapStateML \"state\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->state));
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-state-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrLocalizationMapML is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->map);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-map-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrEventDataLocalizationChangedML member map is invalid");
        return xr_result;
    }
    // Make sure the enum type XrLocalizationMapConfidenceML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrEventDataLocalizationChangedML", "confidence", objects_info, value->confidence)) {
        std::ostringstream oss_enum;
        oss_enum << "XrEventDataLocalizationChangedML contains invalid XrLocalizationMapConfidenceML \"confidence\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->confidence));
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-confidence-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    ValidateXrFlagsResult localization_map_error_flags_ml_result = ValidateXrLocalizationMapErrorFlagsML(value->errorFlags);
    // Flags must be non-zero in this case.
    if (VALIDATE_XR_FLAGS_ZERO == localization_map_error_flags_ml_result) {
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-errorFlags-requiredbitmask",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, "XrLocalizationMapErrorFlagsML \"errorFlags\" flag must be non-zero");
        return XR_ERROR_VALIDATION_FAILURE;
    } else if (VALIDATE_XR_FLAGS_SUCCESS != localization_map_error_flags_ml_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrEventDataLocalizationChangedML invalid member XrLocalizationMapErrorFlagsML \"errorFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->errorFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrEventDataLocalizationChangedML-errorFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}